

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O3

void __thiscall
duckdb::BatchInsertGlobalState::AddCollection
          (BatchInsertGlobalState *this,ClientContext *context,idx_t batch_index,
          idx_t min_batch_index,PhysicalIndex collection_index,
          optional_ptr<duckdb::OptimisticDataWriter,_true> writer)

{
  atomic<unsigned_long> *paVar1;
  RowGroupBatchEntry *pRVar2;
  ClientContext *context_00;
  int iVar3;
  undefined4 extraout_var;
  RowGroupCollection *this_00;
  idx_t iVar4;
  InternalException *pIVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  const_iterator __position;
  pointer pcVar9;
  bool bVar10;
  RowGroupBatchEntry new_entry;
  optional_ptr<duckdb::OptimisticDataWriter,_true> local_90;
  undefined1 local_88 [32];
  RowGroupBatchType local_68;
  idx_t local_60;
  ClientContext *local_58;
  string local_50;
  
  local_90.ptr = writer.ptr;
  if (batch_index < min_batch_index) {
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    local_88._0_8_ = local_88 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,
               "Batch index of the added collection (%llu) is smaller than the min batch index (%llu)"
               ,"");
    InternalException::InternalException<unsigned_long,unsigned_long>
              (pIVar5,(string *)local_88,batch_index,min_batch_index);
    __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar3 = (*(this->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])();
  local_60 = collection_index.index;
  local_58 = context;
  this_00 = DataTable::GetOptimisticCollection
                      ((DataTable *)CONCAT44(extraout_var,iVar3),context,collection_index);
  iVar4 = RowGroupCollection::GetTotalRows(this_00);
  uVar6 = this->row_group_size;
  bVar10 = iVar4 < uVar6;
  if (writer.ptr != (OptimisticDataWriter *)0x0 && !bVar10) {
    optional_ptr<duckdb::OptimisticDataWriter,_true>::CheckValid(&local_90);
    OptimisticDataWriter::WriteLastRowGroup(local_90.ptr,this_00);
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar3 == 0) {
    this->insert_count = this->insert_count + iVar4;
    local_88._0_8_ = batch_index;
    local_88._8_8_ = RowGroupCollection::GetTotalRows(this_00);
    context_00 = local_58;
    local_88._16_8_ = 0;
    local_88._24_8_ = local_60;
    pcVar9 = (pointer)batch_index;
    if (iVar4 < uVar6) {
      local_88._16_8_ = this_00->allocation_size;
      LOCK();
      paVar1 = &(this->memory_manager).unflushed_memory_usage;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + local_88._16_8_;
      UNLOCK();
      pcVar9 = (pointer)local_88._0_8_;
    }
    __position._M_current =
         (this->collections).
         super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
         super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pRVar2 = (this->collections).
             super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
             super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar6 = (long)pRVar2 - (long)__position._M_current;
    if (0 < (long)uVar6) {
      uVar6 = (uVar6 >> 3) * -0x3333333333333333;
      do {
        uVar7 = uVar6 >> 1;
        uVar8 = uVar7;
        if ((pointer)__position._M_current[uVar7].batch_idx < pcVar9) {
          uVar8 = ~uVar7 + uVar6;
          __position._M_current = __position._M_current + uVar7 + 1;
        }
        uVar6 = uVar8;
      } while (0 < (long)uVar8);
    }
    local_68 = bVar10;
    if ((__position._M_current != pRVar2) && ((pointer)(__position._M_current)->batch_idx == pcVar9)
       ) {
      pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "PhysicalBatchInsert::AddCollection error: batch index %d is present in multiple collections. This occurs when batch indexes are not uniquely distributed over threads"
                 ,"");
      InternalException::InternalException<unsigned_long>(pIVar5,&local_50,batch_index);
      __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>::insert
              (&(this->collections).
                super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
               ,__position,(value_type *)local_88);
    if (local_90.ptr != (OptimisticDataWriter *)0x0) {
      ScheduleMergeTasks(this,context_00,min_batch_index);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

void BatchInsertGlobalState::AddCollection(ClientContext &context, const idx_t batch_index, const idx_t min_batch_index,
                                           const PhysicalIndex collection_index,
                                           optional_ptr<OptimisticDataWriter> writer) {
	if (batch_index < min_batch_index) {
		throw InternalException("Batch index of the added collection (%llu) is smaller than the min batch index (%llu)",
		                        batch_index, min_batch_index);
	}
	auto &collection = table.GetStorage().GetOptimisticCollection(context, collection_index);
	auto new_count = collection.GetTotalRows();
	auto batch_type = new_count < row_group_size ? RowGroupBatchType::NOT_FLUSHED : RowGroupBatchType::FLUSHED;
	if (batch_type == RowGroupBatchType::FLUSHED && writer) {
		writer->WriteLastRowGroup(collection);
	}
	lock_guard<mutex> l(lock);
	insert_count += new_count;
	// add the collection to the batch index
	RowGroupBatchEntry new_entry(collection, batch_index, collection_index, batch_type);
	if (batch_type == RowGroupBatchType::NOT_FLUSHED) {
		memory_manager.IncreaseUnflushedMemory(new_entry.unflushed_memory);
	}

	auto it = std::lower_bound(
	    collections.begin(), collections.end(), new_entry,
	    [&](const RowGroupBatchEntry &a, const RowGroupBatchEntry &b) { return a.batch_idx < b.batch_idx; });
	if (it != collections.end() && it->batch_idx == new_entry.batch_idx) {
		throw InternalException("PhysicalBatchInsert::AddCollection error: batch index %d is present in multiple "
		                        "collections. This occurs when "
		                        "batch indexes are not uniquely distributed over threads",
		                        batch_index);
	}
	collections.insert(it, new_entry);
	if (writer) {
		ScheduleMergeTasks(context, min_batch_index);
	}
}